

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O0

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  jtokentype jVar8;
  int iVar9;
  VType VVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference ppUVar11;
  size_type sVar12;
  long in_FS_OFFSET;
  bool bVar13;
  UniValue *top_7;
  UniValue *top_6;
  UniValue *top_5;
  UniValue *top_4;
  UniValue *top_3;
  UniValue *top_2;
  UniValue *top_1;
  VType utyp_1;
  UniValue *top;
  VType utyp;
  bool isObjName;
  bool isArrValue;
  bool isValueOpen;
  char *end;
  char *raw;
  jtokentype last_tok;
  jtokentype tok;
  uint32_t expectMask;
  UniValue *newTop;
  uint consumed;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  UniValue tmpVal_3;
  UniValue tmpVal_2;
  UniValue tmpVal_1;
  UniValue tmpVal;
  string tokenVal;
  jtokentype in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  jtokentype in_stack_fffffffffffffd08;
  VType in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  VType in_stack_fffffffffffffd14;
  VType in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  value_type in_stack_fffffffffffffd60;
  value_type in_stack_fffffffffffffd68;
  value_type in_stack_fffffffffffffd70;
  value_type in_stack_fffffffffffffd78;
  jtokentype local_240;
  undefined1 local_229;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  clear((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  std::vector<UniValue_*,_std::allocator<UniValue_*>_>::vector
            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  local_240 = JTOK_NONE;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  do {
    jVar8 = getJsonToken((string *)in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->typ,
                         (char *)in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    if ((jVar8 == JTOK_NONE) || (jVar8 == JTOK_ERR)) {
      local_229 = 0;
      goto LAB_01ab00e6;
    }
    bVar7 = jsonTokenIsValue(in_stack_fffffffffffffcf8);
    bVar13 = true;
    if ((!bVar7) && (bVar13 = true, jVar8 != JTOK_OBJ_OPEN)) {
      bVar13 = jVar8 == JTOK_ARR_OPEN;
    }
    if (bVar3) {
      if (!bVar13) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      bVar3 = false;
    }
    else if (bVar4) {
      if (!bVar13 && jVar8 != JTOK_ARR_CLOSE) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      bVar4 = false;
    }
    else if (bVar2) {
      if (jVar8 != JTOK_OBJ_CLOSE && jVar8 != JTOK_STRING) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
    }
    else if (bVar5) {
      if (jVar8 != JTOK_COLON) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      bVar5 = false;
    }
    else if ((!bVar5) && (jVar8 == JTOK_COLON)) {
      local_229 = 0;
      goto LAB_01ab00e6;
    }
    if (bVar6) {
      if (bVar13) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      bVar6 = false;
    }
    switch(jVar8) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      iVar9 = 2;
      if (jVar8 == JTOK_OBJ_OPEN) {
        iVar9 = 1;
      }
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (sVar12 == 0) {
        if (iVar9 == 1) {
          setObject((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        }
        else {
          setArray((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        }
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                   (value_type *)0x1aaf90b);
      }
      else {
        in_stack_fffffffffffffd1c = iVar9;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd14,
                 (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  ((vector<UniValue,_std::allocator<UniValue>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        std::vector<UniValue,_std::allocator<UniValue>_>::back
                  ((vector<UniValue,_std::allocator<UniValue>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::push_back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        ~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      }
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (0x200 < sVar12) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      if (iVar9 == 1) {
        bVar2 = true;
      }
      else {
        bVar4 = true;
      }
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if ((sVar12 == 0) || (local_240 == JTOK_COMMA)) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      in_stack_fffffffffffffd14 = (jVar8 != JTOK_OBJ_CLOSE) + VOBJ;
      ppUVar11 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                           ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffd78 = *ppUVar11;
      in_stack_fffffffffffffd18 =
           getType((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (in_stack_fffffffffffffd14 != in_stack_fffffffffffffd18) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      std::vector<UniValue_*,_std::allocator<UniValue_*>_>::pop_back
                ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      bVar6 = true;
      bVar2 = false;
      break;
    case JTOK_COLON:
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (sVar12 == 0) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      ppUVar11 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                           ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffd70 = *ppUVar11;
      VVar10 = getType((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (VVar10 != VOBJ) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      bVar3 = true;
      in_stack_fffffffffffffd10 = 1;
      break;
    case JTOK_COMMA:
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (((sVar12 == 0) || (local_240 == JTOK_COMMA)) || (local_240 == JTOK_ARR_OPEN)) {
        local_229 = 0;
        goto LAB_01ab00e6;
      }
      ppUVar11 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                           ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffd68 = *ppUVar11;
      in_stack_fffffffffffffd0c =
           getType((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (in_stack_fffffffffffffd0c == VOBJ) {
        bVar2 = true;
      }
      else {
        bVar4 = true;
      }
      break;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffd08 = jVar8;
      if (jVar8 != JTOK_KW_NULL) {
        bVar13 = SUB41((uint)in_stack_fffffffffffffd04 >> 0x18,0);
        if (jVar8 == JTOK_KW_TRUE) {
          setBool((UniValue *)CONCAT44(in_stack_fffffffffffffd0c,8),bVar13);
        }
        else if (jVar8 == JTOK_KW_FALSE) {
          setBool((UniValue *)CONCAT44(in_stack_fffffffffffffd0c,9),bVar13);
        }
      }
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (sVar12 == 0) {
        operator=((UniValue *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  (UniValue *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      }
      else {
        ppUVar11 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                             ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        in_stack_fffffffffffffd60 = *ppUVar11;
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  ((vector<UniValue,_std::allocator<UniValue>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        bVar6 = true;
      }
      ~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      break;
    case JTOK_NUMBER:
      std::__cxx11::string::string
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
               in_stack_fffffffffffffd14,
               (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                         ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (sVar12 == 0) {
        operator=((UniValue *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  (UniValue *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      }
      else {
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  ((vector<UniValue,_std::allocator<UniValue>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        bVar6 = true;
      }
      ~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      break;
    case JTOK_STRING:
      if (bVar2) {
        std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                  ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        bVar5 = true;
        bVar2 = false;
      }
      else {
        std::__cxx11::string::string
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                  );
        UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 in_stack_fffffffffffffd14,
                 (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        sVar12 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::size
                           ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        if (sVar12 != 0) {
          std::vector<UniValue_*,_std::allocator<UniValue_*>_>::back
                    ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    ((vector<UniValue,_std::allocator<UniValue>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (value_type *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        }
        else {
          operator=((UniValue *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    (UniValue *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        }
        ~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        if (sVar12 == 0) break;
      }
      bVar6 = true;
      break;
    default:
      local_229 = 0;
      goto LAB_01ab00e6;
    }
    bVar13 = std::vector<UniValue_*,_std::allocator<UniValue_*>_>::empty
                       ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_240 = jVar8;
  } while (((bVar13 ^ 0xffU) & 1) != 0);
  jVar8 = getJsonToken((string *)in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->typ,
                       (char *)in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  if (jVar8 == JTOK_NONE) {
    local_229 = 1;
  }
  else {
    local_229 = 0;
  }
LAB_01ab00e6:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::vector<UniValue_*,_std::allocator<UniValue_*>_>::~vector
            ((vector<UniValue_*,_std::allocator<UniValue_*>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_229);
}

Assistant:

bool UniValue::read(std::string_view str_in)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* raw{str_in.data()};
    const char* end{raw + str_in.size()};
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (stack.size() > MAX_JSON_DEPTH)
                return false;

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}